

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_switch_block
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  bool bVar1;
  pointer this_00;
  bool local_e9;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  undefined8 local_b0;
  allocator<char> local_a1;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  undefined8 local_68;
  allocator<char> local_49;
  string local_48;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_28;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *node;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  node = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  this_00 = std::
            unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
            operator->(parent);
  local_28 = ast_node::add_child(this_00,BLOCK);
  bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_LEFT_BRACE);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_49);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"\'{\' expected");
    local_68 = 1;
    args_00._M_len = 1;
    args_00._M_array = &local_80;
    local_70 = &local_80;
    this_local._7_1_ = append_syntax_error(this,&local_48,0x4a7,args_00);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    next(this);
    do {
      bVar1 = tokenizer::token::operator==(&this->cur_token,TK_CASE);
      local_e9 = true;
      if (!bVar1) {
        local_e9 = tokenizer::token::operator==(&this->cur_token,TK_DEFAULT);
      }
      if (local_e9 == false) {
        bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_RIGHT_BRACE);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                     &local_a1);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_c8,"\'}\' expected");
          local_b0 = 1;
          args._M_len = 1;
          args._M_array = &local_c8;
          local_b8 = &local_c8;
          this_local._7_1_ = append_syntax_error(this,&local_a0,0x4b2,args);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
        }
        else {
          next(this);
          this_local._7_1_ = 1;
        }
        goto LAB_0014d7ea;
      }
      bVar1 = parse_switch_label(this,local_28);
    } while (bVar1);
    this_local._7_1_ = 0;
  }
LAB_0014d7ea:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ast::parse_switch_block(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(BLOCK);

    if (cur_token != tokenizer::TK_LEFT_BRACE) {
        return syntax_error({"'{' expected"});
    }
    next();

    while (cur_token == tokenizer::TK_CASE || cur_token == tokenizer::TK_DEFAULT) {
        if (!parse_switch_label(node)) {
            return false;
        }
    }

    if (cur_token != tokenizer::TK_RIGHT_BRACE) {
        return syntax_error({"'}' expected"});
    }
    next();

    return true;
}